

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall
dg::llvmdg::legacy::GraphBuilder::handleCallInstruction
          (GraphBuilder *this,Instruction *instruction,Block *lastBlock,bool *createBlock,
          bool *createCallReturn)

{
  StringRef RHS;
  StringRef RHS_00;
  bool bVar1;
  Block *lastBlock_00;
  iterator lastBlock_01;
  GraphBuilder *in_RCX;
  Function *in_RDI;
  CallInst *in_R8;
  StringRef LHS;
  Function *function;
  Function *llvmFunction;
  iterator __end2;
  iterator __begin2;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range2;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> llvmFunctions;
  Value *val;
  CallInst *callInst;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *in_stack_ffffffffffffff38
  ;
  GraphBuilder *in_stack_ffffffffffffff48;
  StringRef *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  Block *in_stack_ffffffffffffff68;
  Value *in_stack_ffffffffffffff70;
  GraphBuilder *in_stack_ffffffffffffff78;
  CallInst *callInst_00;
  GraphBuilder *in_stack_ffffffffffffffb0;
  
  lastBlock_00 = (Block *)llvm::cast<llvm::CallInst,llvm::Instruction_const>
                                    ((Instruction *)0x21cf29);
  llvm::CallBase::getCalledOperand((CallBase *)0x21cf3e);
  getCalledFunctions(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  callInst_00 = (CallInst *)&stack0xffffffffffffffb0;
  lastBlock_01 = std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::begin
                           (in_stack_ffffffffffffff38);
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::end
            (in_stack_ffffffffffffff38);
  LHS.Length = in_stack_ffffffffffffff60;
  LHS.Data = in_stack_ffffffffffffff58;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
    ::operator*((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                 *)&stack0xffffffffffffffa0);
    bVar1 = llvm::Function::empty((Function *)0x21cfb9);
    if (bVar1) {
      if (((byte)in_RDI[8] & 1) != 0) {
        llvm::Value::getName();
        llvm::StringRef::StringRef(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
        RHS.Length = (size_t)in_stack_ffffffffffffff50;
        RHS.Data = (char *)in_stack_ffffffffffffff48;
        bVar1 = llvm::operator==(LHS,RHS);
        if (bVar1) {
          bVar1 = createPthreadCreate(in_RCX,in_R8,lastBlock_00);
          *(bool *)&in_RCX->pointsToAnalysis_ = ((ulong)in_RCX->pointsToAnalysis_ & 1) != 0 || bVar1
          ;
        }
        else {
          LHS = (StringRef)llvm::Value::getName();
          llvm::StringRef::StringRef(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
          RHS_00.Length = (size_t)in_stack_ffffffffffffff50;
          RHS_00.Data = (char *)in_stack_ffffffffffffff48;
          bVar1 = llvm::operator==(LHS,RHS_00);
          if (bVar1) {
            bVar1 = createPthreadJoin(in_stack_ffffffffffffffb0,callInst_00,
                                      (Block *)lastBlock_01._M_current);
            *in_R8 = (CallInst)(((byte)*in_R8 & 1) != 0 || bVar1);
          }
        }
      }
    }
    else {
      createOrGetFunction(in_stack_ffffffffffffff48,in_RDI);
      Block::addCallee(in_stack_ffffffffffffff68,(Function *)LHS.Length,(Function *)LHS.Data);
      *in_R8 = (CallInst)0x1;
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
    ::operator++((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                  *)&stack0xffffffffffffffa0);
  }
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
             in_stack_ffffffffffffff50);
  return;
}

Assistant:

void GraphBuilder::handleCallInstruction(const llvm::Instruction *instruction,
                                         Block *lastBlock, bool &createBlock,
                                         bool &createCallReturn) {
    const auto *callInst = llvm::cast<llvm::CallInst>(instruction);
#if LLVM_VERSION_MAJOR >= 8
    auto *val = callInst->getCalledOperand();
#else
    auto *val = callInst->getCalledValue();
#endif
    auto llvmFunctions = getCalledFunctions(val);

    for (const auto *llvmFunction : llvmFunctions) {
        if (!llvmFunction->empty()) {
            auto *function = createOrGetFunction(llvmFunction);
            lastBlock->addCallee(llvmFunction, function);
            createCallReturn |= true;
        } else if (threads) {
            if (llvmFunction->getName() == "pthread_create") {
                createBlock |= createPthreadCreate(callInst, lastBlock);
            } else if (llvmFunction->getName() == "pthread_join") {
                createCallReturn |= createPthreadJoin(callInst, lastBlock);
            }
        }
    }
}